

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O3

void __thiscall
vkt::clipping::anon_unknown_0::ClipDistance::initPrograms
          (ClipDistance *this,SourceCollections *programCollection,CaseDefinition caseDef)

{
  ostream *poVar1;
  char *pcVar2;
  size_t sVar3;
  ProgramSources *pPVar4;
  int iVar5;
  int vertNdx;
  int iVar6;
  string perVertexBlock;
  ostringstream str;
  undefined1 auStack_258 [8];
  ulong local_250;
  ulong local_248;
  string local_240;
  long *local_220;
  long local_218;
  long local_210 [2];
  uint local_200;
  undefined4 uStack_1fc;
  value_type local_1f8;
  SourceCollections *local_1d8;
  ClipDistance *local_1d0;
  char *local_1c8;
  long local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_250 = caseDef._0_8_;
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = '\0';
  local_1d8 = programCollection;
  local_1d0 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"gl_PerVertex {\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    vec4  gl_Position;\n",0x17);
  if (0 < (int)local_250) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    float gl_ClipDistance[",0x1a);
    poVar1 = (ostream *)std::ostream::operator<<(local_1a8,(int)local_250);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
  }
  local_248 = local_250 >> 0x20;
  if (0 < (int)(local_250 >> 0x20)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    float gl_CullDistance[",0x1a);
    poVar1 = (ostream *)std::ostream::operator<<(local_1a8,(int)local_248);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_200);
  if ((size_type *)CONCAT44(uStack_1fc,local_200) != &local_1f8._M_string_length) {
    operator_delete((undefined1 *)CONCAT44(uStack_1fc,local_200),local_1f8._M_string_length + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xb0);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in  vec4 v_position;\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out vec4 out_color;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1c8,local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    gl_Position = v_position;\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"    out_color   = vec4(1.0, 0.5 * (v_position.x + 1.0), 0.0, 1.0);\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"    const int barNdx = gl_VertexIndex / 6;\n",0x2b);
  if (((ulong)local_1d8 >> 0x20 & 1) == 0) {
    if (0 < (int)local_250) {
      iVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    gl_ClipDistance[",0x14);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] = (barNdx == ",0xf);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ? v_position.y : 0.0);\n",0x18);
        iVar5 = iVar5 + 1;
      } while ((int)local_250 != iVar5);
    }
    if (0 < (int)local_248) {
      iVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    gl_CullDistance[",0x14);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] = 0.0;\n",9);
        iVar5 = iVar5 + 1;
      } while ((int)local_248 != iVar5);
    }
  }
  else {
    if (0 < (int)local_250) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    for (int i = 0; i < ",0x18);
      poVar1 = (ostream *)std::ostream::operator<<(local_1a8,(int)local_250);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; ++i)\n",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"        gl_ClipDistance[i] = (barNdx == i ? v_position.y : 0.0);\n",0x41);
    }
    if (0 < (int)local_248) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    for (int i = 0; i < ",0x18);
      poVar1 = (ostream *)std::ostream::operator<<(local_1a8,(int)local_248);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; ++i)\n",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"        gl_CullDistance[i] = 0.0;\n",0x22);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"vert","");
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)local_1d0,&local_240);
  std::__cxx11::stringbuf::str();
  local_200 = 0;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_220,local_218 + (long)local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar4->sources + local_200,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (((ulong)local_1d8 >> 0x28 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xb0);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(vertices = ",0x12);
    poVar1 = (ostream *)std::ostream::operator<<(local_1a8,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") out;\n",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"layout(location = 0) in  vec4 in_color[];\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"layout(location = 0) out vec4 out_color[];\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"in ",3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1c8,local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," gl_in[gl_MaxPatchVertices];\n",0x1d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"out ",4);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1c8,local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," gl_out[];\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    gl_TessLevelInner[0] = 1.0;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    gl_TessLevelInner[1] = 1.0;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    gl_TessLevelOuter[0] = 1.0;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    gl_TessLevelOuter[1] = 1.0;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    gl_TessLevelOuter[2] = 1.0;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    gl_TessLevelOuter[3] = 1.0;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n",
               0x4e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    out_color[gl_InvocationID]          = in_color[gl_InvocationID];\n",0x45)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if (((ulong)local_1d8 >> 0x20 & 1) == 0) {
      if (0 < (int)local_250) {
        iVar5 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"    gl_out[gl_InvocationID].gl_ClipDistance[",0x2c);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,"] = gl_in[gl_InvocationID].gl_ClipDistance[",0x2b);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
          iVar5 = iVar5 + 1;
        } while ((int)local_250 != iVar5);
      }
      if (0 < (int)local_248) {
        iVar5 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"    gl_out[gl_InvocationID].gl_CullDistance[",0x2c);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,"] = gl_in[gl_InvocationID].gl_CullDistance[",0x2b);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
          iVar5 = iVar5 + 1;
        } while ((int)local_248 != iVar5);
      }
    }
    else {
      if (0 < (int)local_250) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    for (int i = 0; i < ",0x18);
        poVar1 = (ostream *)std::ostream::operator<<(local_1a8,(int)local_250);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; ++i)\n",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,
                   "        gl_out[gl_InvocationID].gl_ClipDistance[i] = gl_in[gl_InvocationID].gl_ClipDistance[i];\n"
                   ,0x60);
      }
      if (0 < (int)local_248) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    for (int i = 0; i < ",0x18);
        poVar1 = (ostream *)std::ostream::operator<<(local_1a8,(int)local_248);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; ++i)\n",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,
                   "        gl_out[gl_InvocationID].gl_CullDistance[i] = gl_in[gl_InvocationID].gl_CullDistance[i];\n"
                   ,0x60);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"tesc","");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_1d0,&local_240);
    std::__cxx11::stringbuf::str();
    local_200 = 3;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_220,local_218 + (long)local_220);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar4->sources + local_200,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (local_220 != local_210) {
      operator_delete(local_220,local_210[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xb0);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(triangles, equal_spacing, ccw) in;\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in  vec4 in_color[];\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out vec4 out_color;\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1c8,local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," gl_in[gl_MaxPatchVertices];\n",0x1d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"out ",4);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1c8,local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    vec3 px     = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    vec3 py     = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    vec3 pz     = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    gl_Position = vec4(px + py + pz, 1.0);\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    out_color   = (in_color[0] + in_color[1] + in_color[2]) / 3.0;\n",0x43);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if (((ulong)local_1d8 >> 0x20 & 1) == 0) {
      if (0 < (int)local_250) {
        iVar5 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"    gl_ClipDistance[",0x14);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,"] = gl_TessCoord.x * gl_in[0].gl_ClipDistance[",0x2e);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,"                       + gl_TessCoord.y * gl_in[1].gl_ClipDistance[",
                     0x43);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,"                       + gl_TessCoord.z * gl_in[2].gl_ClipDistance[",
                     0x43);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
          iVar5 = iVar5 + 1;
        } while ((int)local_250 != iVar5);
      }
      if (0 < (int)local_248) {
        iVar5 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"    gl_CullDistance[",0x14);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,"] = gl_TessCoord.x * gl_in[0].gl_CullDistance[",0x2e);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,"                       + gl_TessCoord.y * gl_in[1].gl_CullDistance[",
                     0x43);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,"                       + gl_TessCoord.z * gl_in[2].gl_CullDistance[",
                     0x43);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
          iVar5 = iVar5 + 1;
        } while ((int)local_248 != iVar5);
      }
    }
    else {
      if (0 < (int)local_250) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    for (int i = 0; i < ",0x18);
        poVar1 = (ostream *)std::ostream::operator<<(local_1a8,(int)local_250);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; ++i)\n",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,
                   "        gl_ClipDistance[i] = gl_TessCoord.x * gl_in[0].gl_ClipDistance[i]\n",
                   0x4a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,
                   "                           + gl_TessCoord.y * gl_in[1].gl_ClipDistance[i]\n",
                   0x4a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,
                   "                           + gl_TessCoord.z * gl_in[2].gl_ClipDistance[i];\n",
                   0x4b);
      }
      if (0 < (int)local_248) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    for (int i = 0; i < ",0x18);
        poVar1 = (ostream *)std::ostream::operator<<(local_1a8,(int)local_248);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; ++i)\n",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,
                   "        gl_CullDistance[i] = gl_TessCoord.x * gl_in[0].gl_CullDistance[i]\n",
                   0x4a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,
                   "                           + gl_TessCoord.y * gl_in[1].gl_CullDistance[i]\n",
                   0x4a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,
                   "                           + gl_TessCoord.z * gl_in[2].gl_CullDistance[i];\n",
                   0x4b);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"tese","");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_1d0,&local_240);
    std::__cxx11::stringbuf::str();
    local_200 = 4;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_220,local_218 + (long)local_220);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar4->sources + local_200,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (local_220 != local_210) {
      operator_delete(local_220,local_210[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if (((ulong)local_1d8 >> 0x30 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xb0);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(triangles) in;\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(triangle_strip, max_vertices = 3) out;\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in  vec4 in_color[];\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out vec4 out_color;\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1c8,local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," gl_in[];\n",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"out ",4);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1c8,local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
    iVar5 = 0;
    do {
      if (iVar5 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    gl_Position = gl_in[",0x18);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"].gl_Position;\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    out_color   = in_color[",0x1b);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
      if (((ulong)local_1d8 >> 0x20 & 1) == 0) {
        if (0 < (int)local_250) {
          iVar6 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"    gl_ClipDistance[",0x14);
            poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] = gl_in[",10);
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"].gl_ClipDistance[",0x12);
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
            iVar6 = iVar6 + 1;
          } while ((int)local_250 != iVar6);
        }
        if (0 < (int)local_248) {
          iVar6 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"    gl_CullDistance[",0x14);
            poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] = gl_in[",10);
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"].gl_CullDistance[",0x12);
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
            iVar6 = iVar6 + 1;
          } while ((int)local_248 != iVar6);
        }
      }
      else {
        if (0 < (int)local_250) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"    for (int i = 0; i < ",0x18);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_250);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; ++i)\n",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,"        gl_ClipDistance[i] = gl_in[",0x23);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"].gl_ClipDistance[i];\n",0x16);
        }
        if (0 < (int)local_248) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"    for (int i = 0; i < ",0x18);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_248);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; ++i)\n",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,"        gl_CullDistance[i] = gl_in[",0x23);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"].gl_CullDistance[i];\n",0x16);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    EmitVertex();\n",0x12);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"geom","");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_1d0,&local_240);
    std::__cxx11::stringbuf::str();
    local_200 = 2;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_220,local_218 + (long)local_220);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar4->sources + local_200,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (local_220 != local_210) {
      operator_delete(local_220,local_210[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xb0);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in flat vec4 in_color;\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out vec4 o_color;\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    o_color = vec4(in_color.rgb + vec3(0.0, 0.0, 0.5), 1.0);\n",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"frag","");
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)local_1d0,&local_240);
  std::__cxx11::stringbuf::str();
  local_200 = 1;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_220,local_218 + (long)local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar4->sources + local_200,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDefinition caseDef)
{
	DE_ASSERT(caseDef.numClipDistances + caseDef.numCullDistances <= MAX_COMBINED_CLIP_AND_CULL_DISTANCES);

	std::string perVertexBlock;
	{
		std::ostringstream str;
		str << "gl_PerVertex {\n"
			<< "    vec4  gl_Position;\n";
		if (caseDef.numClipDistances > 0)
			str << "    float gl_ClipDistance[" << caseDef.numClipDistances << "];\n";
		if (caseDef.numCullDistances > 0)
			str << "    float gl_CullDistance[" << caseDef.numCullDistances << "];\n";
		str << "}";
		perVertexBlock = str.str();
	}

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 v_position;\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "out " << perVertexBlock << ";\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = v_position;\n"
			<< "    out_color   = vec4(1.0, 0.5 * (v_position.x + 1.0), 0.0, 1.0);\n"
			<< "\n"
			<< "    const int barNdx = gl_VertexIndex / 6;\n";
		if (caseDef.dynamicIndexing)
		{
			if (caseDef.numClipDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numClipDistances << "; ++i)\n"
					<< "        gl_ClipDistance[i] = (barNdx == i ? v_position.y : 0.0);\n";
			if (caseDef.numCullDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numCullDistances << "; ++i)\n"
					<< "        gl_CullDistance[i] = 0.0;\n";
		}
		else
		{
			for (int i = 0; i < caseDef.numClipDistances; ++i)
				src << "    gl_ClipDistance[" << i << "] = (barNdx == " << i << " ? v_position.y : 0.0);\n";
			for (int i = 0; i < caseDef.numCullDistances; ++i)
				src << "    gl_CullDistance[" << i << "] = 0.0;\n";		// don't cull anything
		}
		src	<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	if (caseDef.enableTessellation)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(vertices = " << NUM_PATCH_CONTROL_POINTS << ") out;\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color[];\n"
			<< "layout(location = 0) out vec4 out_color[];\n"
			<< "\n"
			<< "in " << perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << perVertexBlock << " gl_out[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_TessLevelInner[0] = 1.0;\n"
			<< "    gl_TessLevelInner[1] = 1.0;\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = 1.0;\n"
			<< "    gl_TessLevelOuter[1] = 1.0;\n"
			<< "    gl_TessLevelOuter[2] = 1.0;\n"
			<< "    gl_TessLevelOuter[3] = 1.0;\n"
			<< "\n"
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< "    out_color[gl_InvocationID]          = in_color[gl_InvocationID];\n"
			<< "\n";
		if (caseDef.dynamicIndexing)
		{
			if (caseDef.numClipDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numClipDistances << "; ++i)\n"
					<< "        gl_out[gl_InvocationID].gl_ClipDistance[i] = gl_in[gl_InvocationID].gl_ClipDistance[i];\n";
			if (caseDef.numCullDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numCullDistances << "; ++i)\n"
					<< "        gl_out[gl_InvocationID].gl_CullDistance[i] = gl_in[gl_InvocationID].gl_CullDistance[i];\n";
		}
		else
		{
			for (int i = 0; i < caseDef.numClipDistances; ++i)
				src << "    gl_out[gl_InvocationID].gl_ClipDistance[" << i << "] = gl_in[gl_InvocationID].gl_ClipDistance[" << i << "];\n";
			for (int i = 0; i < caseDef.numCullDistances; ++i)
				src << "    gl_out[gl_InvocationID].gl_CullDistance[" << i << "] = gl_in[gl_InvocationID].gl_CullDistance[" << i << "];\n";
		}
		src << "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	if (caseDef.enableTessellation)
	{
		DE_ASSERT(NUM_PATCH_CONTROL_POINTS == 3);  // assumed in shader code

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(triangles, equal_spacing, ccw) in;\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color[];\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "in " << perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << perVertexBlock << ";\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    vec3 px     = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n"
			<< "    vec3 py     = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n"
			<< "    vec3 pz     = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n"
			<< "    gl_Position = vec4(px + py + pz, 1.0);\n"
			<< "    out_color   = (in_color[0] + in_color[1] + in_color[2]) / 3.0;\n"
			<< "\n";
		if (caseDef.dynamicIndexing)
		{
			if (caseDef.numClipDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numClipDistances << "; ++i)\n"
					<< "        gl_ClipDistance[i] = gl_TessCoord.x * gl_in[0].gl_ClipDistance[i]\n"
					<< "                           + gl_TessCoord.y * gl_in[1].gl_ClipDistance[i]\n"
					<< "                           + gl_TessCoord.z * gl_in[2].gl_ClipDistance[i];\n";
			if (caseDef.numCullDistances > 0)
				src << "    for (int i = 0; i < " << caseDef.numCullDistances << "; ++i)\n"
					<< "        gl_CullDistance[i] = gl_TessCoord.x * gl_in[0].gl_CullDistance[i]\n"
					<< "                           + gl_TessCoord.y * gl_in[1].gl_CullDistance[i]\n"
					<< "                           + gl_TessCoord.z * gl_in[2].gl_CullDistance[i];\n";
		}
		else
		{
			for (int i = 0; i < caseDef.numClipDistances; ++i)
				src << "    gl_ClipDistance[" << i << "] = gl_TessCoord.x * gl_in[0].gl_ClipDistance[" << i << "]\n"
					<< "                       + gl_TessCoord.y * gl_in[1].gl_ClipDistance[" << i << "]\n"
					<< "                       + gl_TessCoord.z * gl_in[2].gl_ClipDistance[" << i << "];\n";
			for (int i = 0; i < caseDef.numCullDistances; ++i)
				src << "    gl_CullDistance[" << i << "] = gl_TessCoord.x * gl_in[0].gl_CullDistance[" << i << "]\n"
					<< "                       + gl_TessCoord.y * gl_in[1].gl_CullDistance[" << i << "]\n"
					<< "                       + gl_TessCoord.z * gl_in[2].gl_CullDistance[" << i << "];\n";
		}
		src << "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}

	if (caseDef.enableGeometry)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = 3) out;\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color[];\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "in " << perVertexBlock << " gl_in[];\n"
			<< "\n"
			<< "out " << perVertexBlock << ";\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n";
		for (int vertNdx = 0; vertNdx < 3; ++vertNdx)
		{
			if (vertNdx > 0)
				src << "\n";
			src << "    gl_Position = gl_in[" << vertNdx << "].gl_Position;\n"
				<< "    out_color   = in_color[" << vertNdx << "];\n";
			if (caseDef.dynamicIndexing)
			{
				if (caseDef.numClipDistances > 0)
					src << "    for (int i = 0; i < " << caseDef.numClipDistances << "; ++i)\n"
						<< "        gl_ClipDistance[i] = gl_in[" << vertNdx << "].gl_ClipDistance[i];\n";
				if (caseDef.numCullDistances > 0)
					src << "    for (int i = 0; i < " << caseDef.numCullDistances << "; ++i)\n"
						<< "        gl_CullDistance[i] = gl_in[" << vertNdx << "].gl_CullDistance[i];\n";
			}
			else
			{
				for (int i = 0; i < caseDef.numClipDistances; ++i)
					src << "    gl_ClipDistance[" << i << "] = gl_in[" << vertNdx << "].gl_ClipDistance[" << i << "];\n";
				for (int i = 0; i < caseDef.numCullDistances; ++i)
					src << "    gl_CullDistance[" << i << "] = gl_in[" << vertNdx << "].gl_CullDistance[" << i << "];\n";
			}
			src << "    EmitVertex();\n";
		}
		src	<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in flat vec4 in_color;\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = vec4(in_color.rgb + vec3(0.0, 0.0, 0.5), 1.0);\n"  // mix with a constant color in case variable wasn't passed correctly through stages
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}